

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O1

int Spatializer::DistanceAttenuationCallback
              (UnityAudioEffectState *state,float distanceIn,float attenuationIn,
              float *attenuationOut)

{
  float *pfVar1;
  
  pfVar1 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar1 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = Spatializer::EffectData]");
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    *attenuationOut =
         (1.0 / ((ABS(1.0 - distanceIn) + distanceIn + 1.0) * 0.5)) * pfVar1[2] +
         attenuationIn * *pfVar1 + pfVar1[1];
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = Spatializer::EffectData]");
}

Assistant:

static UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK DistanceAttenuationCallback(UnityAudioEffectState* state, float distanceIn, float attenuationIn, float* attenuationOut)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        *attenuationOut =
            data->p[P_AUDIOSRCATTN] * attenuationIn +
            data->p[P_FIXEDVOLUME] +
            data->p[P_CUSTOMFALLOFF] * (1.0f / FastMax(1.0f, distanceIn));
        return UNITY_AUDIODSP_OK;
    }